

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void test<BinTrees::RBTree<int>>(void)

{
  RBTree<int> *pRVar1;
  long *plVar2;
  ostream *this;
  long lVar3;
  int *piVar4;
  initializer_list<int> l;
  int sum;
  int local_94;
  RBTree<int> local_90 [3];
  
  local_94 = 0;
  piVar4 = &DAT_001040bc;
  pRVar1 = local_90;
  for (lVar3 = 0x1e; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pRVar1->super_BinSTree<int>).super_BinTree<int>.v = *piVar4;
    piVar4 = piVar4 + 1;
    pRVar1 = (RBTree<int> *)&(pRVar1->super_BinSTree<int>).super_BinTree<int>.field_0x4;
  }
  l._M_len = (size_type)&local_94;
  l._M_array = (iterator)0x1e;
  pRVar1 = BinTrees::RBTree<int>::gen(local_90,l,(int *)0x0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"root:",5);
  plVar2 = (long *)std::ostream::operator<<
                             ((ostream *)&std::cout,
                              (pRVar1->super_BinSTree<int>).super_BinTree<int>.v);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  this = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(this,"result:",7);
  plVar2 = (long *)std::ostream::operator<<((ostream *)this,local_94);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  BinTrees::BinSTree<int>::~BinSTree(&pRVar1->super_BinSTree<int>);
  operator_delete(pRVar1,0x28);
  return;
}

Assistant:

void test() {
    int sum = 0;
    auto *t = T::gen({3566, 2472, 1180, 2948, 2286, 4414, 1207, 2110, 1951, 4271,
                      1690, 3574, 4297, 4232, 2609, 1367, 3893, 1693, 1997, 1589,
                      3140, 2063, 2359, 3291, 2699, 4179, 2333, 3786, 1458, 3427}, sum);

    cout << "root:" << t->V() << endl << "result:" << sum << endl;

    delete t;
}